

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int vs_vlc(bitstream *str,uint32_t *val,vs_vlc_val *tab)

{
  vs_vlc_val *pvVar1;
  int iVar2;
  uint uVar3;
  uint32_t *val_00;
  long lVar4;
  int *piVar5;
  int *piVar6;
  ulong uVar7;
  uint32_t bit [32];
  uint32_t local_b8 [34];
  
  if (str->dir == VS_ENCODE) {
    if (tab->blen != 0) {
      do {
        if (*val == tab->val) {
          if (tab->blen < 1) {
            return 0;
          }
          piVar6 = tab->bits;
          lVar4 = 0;
          do {
            local_b8[0] = *piVar6;
            iVar2 = vs_u(str,local_b8,1);
            if (iVar2 != 0) {
              return 1;
            }
            lVar4 = lVar4 + 1;
            piVar6 = piVar6 + 1;
          } while (lVar4 < tab->blen);
          return 0;
        }
        pvVar1 = tab + 1;
        tab = tab + 1;
      } while (pvVar1->blen != 0);
    }
    vs_vlc_cold_2();
  }
  else {
    if (tab->blen != 0) {
      piVar6 = &tab->blen;
      piVar5 = tab->bits;
      uVar3 = 0;
      lVar4 = 0;
      do {
        if (*piVar6 < 1) {
          iVar2 = 0;
        }
        else {
          val_00 = local_b8;
          uVar7 = 0;
          do {
            if (uVar7 == uVar3) {
              iVar2 = vs_u(str,val_00,1);
              if (iVar2 != 0) {
                return 1;
              }
              uVar3 = (int)uVar7 + 1;
            }
            if (*val_00 != piVar5[uVar7]) break;
            uVar7 = uVar7 + 1;
            val_00 = val_00 + 1;
          } while ((long)uVar7 < (long)*piVar6);
          iVar2 = (int)uVar7;
        }
        if (iVar2 == *piVar6) {
          *val = tab[lVar4].val;
          return 0;
        }
        piVar6 = &tab[lVar4 + 1].blen;
        piVar5 = piVar5 + 0x22;
        lVar4 = lVar4 + 1;
      } while (*piVar6 != 0);
    }
    vs_vlc_cold_1();
  }
  return 1;
}

Assistant:

int vs_vlc(struct bitstream *str, uint32_t *val, const struct vs_vlc_val *tab) {
	if (str->dir == VS_ENCODE) {
		int i, j;
		for (i = 0; tab[i].blen; i++) {
			if (*val == tab[i].val) {
				uint32_t bit;
				for (j = 0; j < tab[i].blen; j++) {
					bit = tab[i].bits[j];
					if (vs_u(str, &bit, 1))
						return 1;
				}
				return 0;
			}
		}
		fprintf(stderr, "No VLC code for a value\n");
		return 1;
	} else {
		int i, j;
		uint32_t bit[32];
		int n = 0;
		for (i = 0; tab[i].blen; i++) {
			for (j = 0; j < tab[i].blen; j++) {
				if (j == n) {
					if (vs_u(str, &bit[j], 1)) return 1;
					n = j + 1;
				}
				if (bit[j] != tab[i].bits[j])
					break;
			}
			if (j == tab[i].blen) {
				*val = tab[i].val;
				return 0;
			}
		}
		fprintf(stderr, "Invalid VLC code\n");
		return 1;
	}
}